

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompoundString.cpp
# Opt level: O0

Block * __thiscall
Js::CompoundString::BlockInfo::CopyBuffer
          (BlockInfo *this,void *buffer,CharCount usedCharLength,bool reserveMoreSpace,
          Recycler *recycler)

{
  code *pcVar1;
  bool bVar2;
  CharCount CVar3;
  undefined4 *puVar4;
  char16 *pcVar5;
  Type *pTVar6;
  Block *block;
  CharCount charCapacity;
  Recycler *recycler_local;
  bool reserveMoreSpace_local;
  CharCount usedCharLength_local;
  void *buffer_local;
  BlockInfo *this_local;
  
  if (buffer == (void *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                ,0x178,"(buffer)","buffer");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if (recycler == (Recycler *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                ,0x179,"(recycler)","recycler");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  block._4_4_ = AlignCharCapacityForAllocation(usedCharLength);
  if (reserveMoreSpace) {
    block._4_4_ = GrowCharCapacity(block._4_4_);
  }
  bVar2 = ShouldAllocateBuffer(block._4_4_);
  if (bVar2) {
    AllocateBuffer(this,block._4_4_,recycler);
    this->charLength = usedCharLength;
    pcVar5 = Chars(this);
    pTVar6 = Block::Pointers(pcVar5);
    CVar3 = Block::PointerLengthFromCharLength(block._4_4_);
    Memory::
    ArrayWriteBarrierVerifyBits<Memory::WriteBarrierPtr<void>,Memory::WriteBarrierPtr<void>,Memory::Recycler>
              (pTVar6,(ulong)CVar3);
    pcVar5 = Chars(this);
    js_wmemcpy_s(pcVar5,(ulong)block._4_4_,(char16 *)buffer,(ulong)usedCharLength);
    pTVar6 = Pointers(this);
    CVar3 = PointerLength(this);
    Memory::
    ArrayWriteBarrier<Memory::WriteBarrierPtr<void>,Memory::WriteBarrierPtr<void>,Memory::Recycler>
              (pTVar6,(ulong)CVar3);
    this_local = (BlockInfo *)0x0;
  }
  else {
    this_local = (BlockInfo *)Block::New(buffer,usedCharLength,reserveMoreSpace,recycler);
    CopyFrom(this,(Block *)this_local);
  }
  return (Block *)this_local;
}

Assistant:

CompoundString::Block *CompoundString::BlockInfo::CopyBuffer(
        const void *const buffer,
        const CharCount usedCharLength,
        const bool reserveMoreSpace,
        Recycler *const recycler)
    {
        Assert(buffer);
        Assert(recycler);

        CharCount charCapacity = AlignCharCapacityForAllocation(usedCharLength);
        if(reserveMoreSpace)
            charCapacity = GrowCharCapacity(charCapacity);
        if(ShouldAllocateBuffer(charCapacity))
        {
            AllocateBuffer(charCapacity, recycler);
            charLength = usedCharLength;

            ArrayWriteBarrierVerifyBits(Block::Pointers(Chars()), Block::PointerLengthFromCharLength(charCapacity));
            js_wmemcpy_s(Chars(), charCapacity, (const char16*)(buffer), usedCharLength);
            // SWB: buffer may contain chars or pointers. Trigger write barrier for the whole buffer.
            ArrayWriteBarrier(Pointers(), PointerLength());
            return nullptr;
        }

        Block *const block = Block::New(buffer, usedCharLength, reserveMoreSpace, recycler);
        CopyFrom(block);
        return block;
    }